

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3HashInsert(Hash *pH,char *pKey,void *data)

{
  uint *puVar1;
  _ht *p_Var2;
  HashElem *pHVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  HashElem *pHVar7;
  _ht *p_Var8;
  byte *pbVar9;
  HashElem *pHVar10;
  byte bVar11;
  void *pvVar12;
  uint h;
  uint local_44;
  ulong local_40;
  _ht *local_38;
  
  pHVar7 = findElementWithHash(pH,pKey,&local_44);
  pvVar12 = pHVar7->data;
  if (pvVar12 == (void *)0x0) {
    if (data != (void *)0x0) {
      pHVar7 = (HashElem *)sqlite3Malloc(0x20);
      if (pHVar7 == (HashElem *)0x0) {
        return data;
      }
      pHVar7->pKey = pKey;
      pHVar7->data = data;
      uVar4 = pH->count + 1;
      pH->count = uVar4;
      if ((9 < uVar4) && (pH->htsize * 2 < uVar4)) {
        uVar6 = 0x40;
        if (uVar4 * 2 < 0x40) {
          uVar6 = uVar4 * 2;
        }
        if (uVar6 != pH->htsize) {
          if (sqlite3Hooks_0 != (code *)0x0) {
            (*sqlite3Hooks_0)();
          }
          p_Var8 = (_ht *)sqlite3Malloc((ulong)(uVar6 << 4));
          if (sqlite3Hooks_1 != (code *)0x0) {
            (*sqlite3Hooks_1)();
          }
          if (p_Var8 != (_ht *)0x0) {
            sqlite3_free(pH->ht);
            pH->ht = p_Var8;
            iVar5 = (*sqlite3Config.m.xSize)(p_Var8);
            local_40 = (ulong)(uint)(iVar5 >> 4);
            pH->htsize = iVar5 >> 4;
            uVar4 = 0;
            local_38 = p_Var8;
            memset(p_Var8,0,local_40 << 4);
            pHVar3 = pH->first;
            pH->first = (HashElem *)0x0;
            while (pHVar3 != (HashElem *)0x0) {
              pbVar9 = (byte *)pHVar3->pKey;
              bVar11 = *pbVar9;
              uVar6 = 0;
              if (bVar11 != 0) {
                uVar6 = 0;
                do {
                  pbVar9 = pbVar9 + 1;
                  uVar6 = (""[bVar11] + uVar6) * -0x61c8864f;
                  bVar11 = *pbVar9;
                } while (bVar11 != 0);
              }
              pHVar10 = pHVar3->next;
              insertElement(pH,local_38 + (ulong)uVar6 % (local_40 & 0xffffffff),pHVar3);
              pHVar3 = pHVar10;
            }
            bVar11 = *pKey;
            if (bVar11 != 0) {
              pbVar9 = (byte *)(pKey + 1);
              uVar4 = 0;
              do {
                uVar4 = (""[bVar11] + uVar4) * -0x61c8864f;
                bVar11 = *pbVar9;
                pbVar9 = pbVar9 + 1;
              } while (bVar11 != 0);
            }
            local_44 = uVar4 % pH->htsize;
          }
        }
      }
      p_Var8 = pH->ht + local_44;
      if (pH->ht == (_ht *)0x0) {
        p_Var8 = (_ht *)0x0;
      }
      insertElement(pH,p_Var8,pHVar7);
    }
    pvVar12 = (void *)0x0;
  }
  else if (data == (void *)0x0) {
    pHVar3 = pHVar7->prev;
    pHVar10 = (HashElem *)&pH->first;
    if (pHVar3 != (HashElem *)0x0) {
      pHVar10 = pHVar3;
    }
    pHVar10->next = pHVar7->next;
    pHVar10 = pHVar7->next;
    if (pHVar10 != (HashElem *)0x0) {
      pHVar10->prev = pHVar3;
    }
    p_Var8 = pH->ht;
    if (p_Var8 != (_ht *)0x0) {
      p_Var2 = p_Var8 + local_44;
      if (p_Var8[local_44].chain == pHVar7) {
        p_Var2->chain = pHVar10;
      }
      p_Var2->count = p_Var2->count - 1;
    }
    sqlite3_free(pHVar7);
    puVar1 = &pH->count;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      sqlite3HashClear(pH);
    }
  }
  else {
    pHVar7->data = data;
    pHVar7->pKey = pKey;
  }
  return pvVar12;
}

Assistant:

SQLITE_PRIVATE void *sqlite3HashInsert(Hash *pH, const char *pKey, void *data){
  unsigned int h;       /* the hash of the key modulo hash table size */
  HashElem *elem;       /* Used to loop thru the element list */
  HashElem *new_elem;   /* New element added to the pH */

  assert( pH!=0 );
  assert( pKey!=0 );
  elem = findElementWithHash(pH,pKey,&h);
  if( elem->data ){
    void *old_data = elem->data;
    if( data==0 ){
      removeElementGivenHash(pH,elem,h);
    }else{
      elem->data = data;
      elem->pKey = pKey;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  new_elem = (HashElem*)sqlite3Malloc( sizeof(HashElem) );
  if( new_elem==0 ) return data;
  new_elem->pKey = pKey;
  new_elem->data = data;
  pH->count++;
  if( pH->count>=10 && pH->count > 2*pH->htsize ){
    if( rehash(pH, pH->count*2) ){
      assert( pH->htsize>0 );
      h = strHash(pKey) % pH->htsize;
    }
  }
  insertElement(pH, pH->ht ? &pH->ht[h] : 0, new_elem);
  return 0;
}